

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void read_tile_info(AV1Decoder *pbi,aom_read_bit_buffer *rb)

{
  int iVar1;
  long lVar2;
  aom_read_bit_buffer *in_RSI;
  long in_RDI;
  AV1_COMMON *cm;
  aom_read_bit_buffer *in_stack_00000038;
  AV1_COMMON *in_stack_00000040;
  
  lVar2 = in_RDI + 0x3b60;
  read_tile_info_max_tile(in_stack_00000040,in_stack_00000038);
  *(undefined4 *)(in_RDI + 0x5f720) = 0;
  if (1 < *(int *)(lVar2 + 0x60a4) * *(int *)(lVar2 + 0x60a0)) {
    iVar1 = aom_rb_read_literal(in_RSI,(int)((ulong)lVar2 >> 0x20));
    *(int *)(in_RDI + 0x5f720) = iVar1;
    if (*(int *)(lVar2 + 0x60a4) * *(int *)(lVar2 + 0x60a0) <= *(int *)(in_RDI + 0x5f720)) {
      aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_CORRUPT_FRAME,
                         "Invalid context_update_tile_id");
    }
    iVar1 = aom_rb_read_literal(in_RSI,(int)((ulong)lVar2 >> 0x20));
    *(int *)(in_RDI + 0x58d98) = iVar1 + 1;
  }
  return;
}

Assistant:

static inline void read_tile_info(AV1Decoder *const pbi,
                                  struct aom_read_bit_buffer *const rb) {
  AV1_COMMON *const cm = &pbi->common;

  read_tile_info_max_tile(cm, rb);

  pbi->context_update_tile_id = 0;
  if (cm->tiles.rows * cm->tiles.cols > 1) {
    // tile to use for cdf update
    pbi->context_update_tile_id =
        aom_rb_read_literal(rb, cm->tiles.log2_rows + cm->tiles.log2_cols);
    if (pbi->context_update_tile_id >= cm->tiles.rows * cm->tiles.cols) {
      aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                         "Invalid context_update_tile_id");
    }
    // tile size magnitude
    pbi->tile_size_bytes = aom_rb_read_literal(rb, 2) + 1;
  }
}